

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O1

uchar * base64_decode(uchar *code)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  uchar *puVar6;
  byte *pbVar7;
  long lVar8;
  
  sVar3 = strlen((char *)code);
  pcVar4 = strstr((char *)code,"==");
  if (pcVar4 == (char *)0x0) {
    pcVar4 = strchr((char *)code,0x3d);
    sVar5 = sVar3 + 3;
    if (-1 < (long)sVar3) {
      sVar5 = sVar3;
    }
    lVar8 = ((long)sVar5 >> 2) * 3 + -1 + (ulong)(pcVar4 == (char *)0x0);
  }
  else {
    sVar5 = sVar3 + 3;
    if (-1 < (long)sVar3) {
      sVar5 = sVar3;
    }
    lVar8 = ((long)sVar5 >> 2) * 3 + -2;
  }
  puVar6 = (uchar *)malloc(lVar8 + 1);
  puVar6[lVar8] = '\0';
  if (2 < (long)sVar3) {
    pbVar7 = puVar6 + 2;
    lVar8 = 0;
    do {
      uVar1 = *(uint *)(&DAT_00107280 + (ulong)code[lVar8 + 1] * 4);
      pbVar7[-2] = (byte)(uVar1 >> 4) & 0xf |
                   (byte)(*(int *)(&DAT_00107280 + (ulong)code[lVar8] * 4) << 2);
      uVar2 = *(uint *)(&DAT_00107280 + (ulong)code[lVar8 + 2] * 4);
      pbVar7[-1] = (byte)(uVar2 >> 2) & 0x3f | (byte)(uVar1 << 4);
      *pbVar7 = (byte)(uVar2 << 6) |
                (byte)*(undefined4 *)(&DAT_00107280 + (ulong)code[lVar8 + 3] * 4);
      lVar8 = lVar8 + 4;
      pbVar7 = pbVar7 + 3;
    } while (lVar8 < (long)(sVar3 - 2));
  }
  return puVar6;
}

Assistant:

unsigned char *base64_decode(unsigned char *code) {
//根据base64表，以字符找到对应的十进制数据
    int table[] = {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
                   0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
                   0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
                   0, 0, 0, 0, 0, 0, 0, 62, 0, 0, 0,
                   63, 52, 53, 54, 55, 56, 57, 58,
                   59, 60, 61, 0, 0, 0, 0, 0, 0, 0, 0,
                   1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12,
                   13, 14, 15, 16, 17, 18, 19, 20, 21,
                   22, 23, 24, 25, 0, 0, 0, 0, 0, 0, 26,
                   27, 28, 29, 30, 31, 32, 33, 34, 35,
                   36, 37, 38, 39, 40, 41, 42, 43, 44,
                   45, 46, 47, 48, 49, 50, 51
    };
    long len;
    long str_len;
    unsigned char *res;
    int i, j;

//计算解码后的字符串长度
    len = strlen(reinterpret_cast<const char *>(code));
//判断编码后的字符串后是否有=
    if (strstr(reinterpret_cast<char *>(code), "=="))
        str_len = len / 4 * 3 - 2;
    else if (strstr(reinterpret_cast<char *>(code), "="))
        str_len = len / 4 * 3 - 1;
    else
        str_len = len / 4 * 3;

    res = static_cast<unsigned char *>(malloc(sizeof(unsigned char) * str_len + 1));
    res[str_len] = '\0';

//以4个字符为一位进行解码
    for (i = 0, j = 0; i < len - 2; j += 3, i += 4) {
        res[j] = ((unsigned char) table[code[i]]) << 2 |
                 (((unsigned char) table[code[i + 1]]) >> 4); //取出第一个字符对应base64表的十进制数的前6位与第二个字符对应base64表的十进制数的后2位进行组合
        res[j + 1] = (((unsigned char) table[code[i + 1]]) << 4) | (((unsigned char) table[code[i + 2]])
                >> 2); //取出第二个字符对应base64表的十进制数的后4位与第三个字符对应bas464表的十进制数的后4位进行组合
        res[j + 2] = (((unsigned char) table[code[i + 2]]) << 6) |
                     ((unsigned char) table[code[i + 3]]); //取出第三个字符对应base64表的十进制数的后2位与第4个字符进行组合
    }

    return res;

}